

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

bool __thiscall
cmLocalUnixMakefileGenerator3::UpdateDependencies
          (cmLocalUnixMakefileGenerator3 *this,char *tgtInfo,bool verbose,bool color)

{
  cmFileTimeComparison *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  size_t sVar5;
  ostream *poVar6;
  char *pcVar7;
  bool bVar8;
  bool bVar9;
  string internalDependFile;
  int result_1;
  string dependFile;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  validDependencies;
  string dirInfoFile;
  string dir;
  ostringstream msg;
  long *local_6a8;
  long local_6a0;
  long local_698 [2];
  long *local_688 [2];
  long local_678 [2];
  long *local_668 [2];
  long local_658 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  local_648;
  int local_618;
  undefined4 uStack_614;
  long local_610;
  long local_608 [2];
  string local_5f8;
  undefined1 local_5d8 [48];
  bool local_5a8;
  cmFileTimeComparison *local_5a0;
  ios_base local_568 [1336];
  
  bVar1 = cmMakefile::ReadListFile
                    ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile,tgtInfo);
  if (((bVar1) && (cmSystemTools::s_ErrorOccured == false)) &&
     (cmSystemTools::s_FatalErrorOccured == false)) {
    bVar1 = cmSystemTools::GetInterruptFlag();
    if (!bVar1) goto LAB_0040b8dc;
  }
  cmSystemTools::Error("Target DependInfo.cmake file not found",(char *)0x0,(char *)0x0,(char *)0x0)
  ;
LAB_0040b8dc:
  CheckMultipleOutputs(this,verbose);
  std::__cxx11::string::string((string *)local_5d8,tgtInfo,(allocator *)&local_648);
  cmsys::SystemTools::GetFilenamePath(&local_5f8,(string *)local_5d8);
  if ((undefined1 *)local_5d8._0_8_ != local_5d8 + 0x10) {
    operator_delete((void *)local_5d8._0_8_,local_5d8._16_8_ + 1);
  }
  local_6a8 = local_698;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_6a8,local_5f8._M_dataplus._M_p,
             local_5f8._M_dataplus._M_p + local_5f8._M_string_length);
  std::__cxx11::string::append((char *)&local_6a8);
  local_668[0] = local_658;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_668,local_5f8._M_dataplus._M_p,
             local_5f8._M_dataplus._M_p + local_5f8._M_string_length);
  std::__cxx11::string::append((char *)local_668);
  this_00 = ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            CMakeInstance->FileComparison;
  bVar1 = cmFileTimeComparison::FileTimeCompare(this_00,(char *)local_6a8,tgtInfo,&local_618);
  bVar8 = -1 < local_618;
  if (verbose && (!bVar1 || !bVar8)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5d8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d8,"Dependee \"",10);
    if (tgtInfo == (char *)0x0) {
      std::ios::clear((int)&local_6a8 + (int)*(undefined8 *)(local_5d8._0_8_ + -0x18) + 0xd0);
    }
    else {
      sVar5 = strlen(tgtInfo);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d8,tgtInfo,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_5d8,"\" is newer than depender \"",0x1a);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_5d8,(char *)local_6a8,local_6a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\".",2);
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    cmSystemTools::Stdout((char *)local_648._M_impl._0_8_);
    if ((_Base_ptr *)local_648._M_impl._0_8_ !=
        &local_648._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_648._M_impl._0_8_,
                      (ulong)((long)&(local_648._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                     _M_color + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5d8);
    std::ios_base::~ios_base(local_568);
  }
  pcVar7 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)&local_618,pcVar7,(allocator *)local_5d8);
  std::__cxx11::string::append((char *)&local_618);
  std::__cxx11::string::append((char *)&local_618);
  bVar2 = cmFileTimeComparison::FileTimeCompare
                    (this_00,(char *)local_6a8,(char *)CONCAT44(uStack_614,local_618),
                     (int *)local_688);
  bVar9 = -1 < (int)local_688[0];
  if (bVar2 && bVar9) {
    local_648._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_648._M_impl.super__Rb_tree_header._M_header;
    local_648._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_648._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_648._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_648._M_impl.super__Rb_tree_header._M_header._M_right =
         local_648._M_impl.super__Rb_tree_header._M_header._M_left;
    cmDependsC::cmDependsC((cmDependsC *)local_5d8);
    local_5a8 = verbose;
    local_5a0 = this_00;
    bVar3 = cmDepends::Check((cmDepends *)local_5d8,(char *)local_668[0],(char *)local_6a8,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
                              *)&local_648);
    cmDependsC::~cmDependsC((cmDependsC *)local_5d8);
  }
  else {
    if (verbose) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5d8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d8,"Dependee \"",10);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_5d8,(char *)CONCAT44(uStack_614,local_618),local_610);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" is newer than depender \"",0x1a)
      ;
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_6a8,local_6a0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\".",2);
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      cmSystemTools::Stdout((char *)local_648._M_impl._0_8_);
      if ((_Base_ptr *)local_648._M_impl._0_8_ !=
          &local_648._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)local_648._M_impl._0_8_,
                        (ulong)((long)&(local_648._M_impl.super__Rb_tree_header._M_header._M_parent)
                                       ->_M_color + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5d8);
      std::ios_base::~ios_base(local_568);
    }
    local_648._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_648._M_impl.super__Rb_tree_header._M_header;
    local_648._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_648._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_648._M_impl.super__Rb_tree_header._M_node_count = 0;
    bVar3 = true;
    local_648._M_impl.super__Rb_tree_header._M_header._M_right =
         local_648._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  bVar4 = true;
  if (((bVar1 && bVar8) & (bVar2 && bVar9) & bVar3) == 0) {
    cmsys::SystemTools::GetFilenameName((string *)local_5d8,&local_5f8);
    std::__cxx11::string::substr((ulong)local_688,(ulong)local_5d8);
    std::__cxx11::string::operator=((string *)local_5d8,(string *)local_688);
    if (local_688[0] != local_678) {
      operator_delete(local_688[0],local_678[0] + 1);
    }
    local_688[0] = local_678;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_688,"Scanning dependencies of target ","");
    std::__cxx11::string::_M_append((char *)local_688,local_5d8._0_8_);
    cmSystemTools::MakefileColorEcho(0x106,(char *)local_688[0],true,color);
    bVar4 = ScanDependencies(this,local_5f8._M_dataplus._M_p,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
                              *)&local_648);
    if (local_688[0] != local_678) {
      operator_delete(local_688[0],local_678[0] + 1);
    }
    if ((undefined1 *)local_5d8._0_8_ != local_5d8 + 0x10) {
      operator_delete((void *)local_5d8._0_8_,local_5d8._16_8_ + 1);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  ::~_Rb_tree(&local_648);
  if ((long *)CONCAT44(uStack_614,local_618) != local_608) {
    operator_delete((long *)CONCAT44(uStack_614,local_618),local_608[0] + 1);
  }
  if (local_668[0] != local_658) {
    operator_delete(local_668[0],local_658[0] + 1);
  }
  if (local_6a8 != local_698) {
    operator_delete(local_6a8,local_698[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool cmLocalUnixMakefileGenerator3::UpdateDependencies(const char* tgtInfo,
                                                       bool verbose,
                                                       bool color)
{
  // read in the target info file
  if(!this->Makefile->ReadListFile(tgtInfo) ||
     cmSystemTools::GetErrorOccuredFlag())
    {
    cmSystemTools::Error("Target DependInfo.cmake file not found");
    }

  // Check if any multiple output pairs have a missing file.
  this->CheckMultipleOutputs(verbose);

  std::string dir = cmSystemTools::GetFilenamePath(tgtInfo);
  std::string internalDependFile = dir + "/depend.internal";
  std::string dependFile = dir + "/depend.make";

  // If the target DependInfo.cmake file has changed since the last
  // time dependencies were scanned then force rescanning.  This may
  // happen when a new source file is added and CMake regenerates the
  // project but no other sources were touched.
  bool needRescanDependInfo = false;
  cmFileTimeComparison* ftc =
    this->GlobalGenerator->GetCMakeInstance()->GetFileComparison();
  {
  int result;
  if(!ftc->FileTimeCompare(internalDependFile.c_str(), tgtInfo, &result) ||
     result < 0)
    {
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Dependee \"" << tgtInfo
          << "\" is newer than depender \""
          << internalDependFile << "\"." << std::endl;
      cmSystemTools::Stdout(msg.str().c_str());
      }
    needRescanDependInfo = true;
    }
  }

  // If the directory information is newer than depend.internal, include dirs
  // may have changed. In this case discard all old dependencies.
  bool needRescanDirInfo = false;
  std::string dirInfoFile = this->GetCurrentBinaryDirectory();
  dirInfoFile += cmake::GetCMakeFilesDirectory();
  dirInfoFile += "/CMakeDirectoryInformation.cmake";
  {
  int result;
  if(!ftc->FileTimeCompare(internalDependFile.c_str(),
                           dirInfoFile.c_str(), &result) || result < 0)
    {
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Dependee \"" << dirInfoFile
          << "\" is newer than depender \""
          << internalDependFile << "\"." << std::endl;
      cmSystemTools::Stdout(msg.str().c_str());
      }
    needRescanDirInfo = true;
    }
  }

  // Check the implicit dependencies to see if they are up to date.
  // The build.make file may have explicit dependencies for the object
  // files but these will not affect the scanning process so they need
  // not be considered.
  std::map<std::string, cmDepends::DependencyVector> validDependencies;
  bool needRescanDependencies = false;
  if (needRescanDirInfo == false)
    {
    cmDependsC checker;
    checker.SetVerbose(verbose);
    checker.SetFileComparison(ftc);
    // cmDependsC::Check() fills the vector validDependencies() with the
    // dependencies for those files where they are still valid, i.e. neither
    // the files themselves nor any files they depend on have changed.
    // We don't do that if the CMakeDirectoryInformation.cmake file has
    // changed, because then potentially all dependencies have changed.
    // This information is given later on to cmDependsC, which then only
    // rescans the files where it did not get valid dependencies via this
    // dependency vector. This means that in the normal case, when only
    // few or one file have been edited, then also only this one file is
    // actually scanned again, instead of all files for this target.
    needRescanDependencies = !checker.Check(dependFile.c_str(),
                                            internalDependFile.c_str(),
                                            validDependencies);
    }

  if(needRescanDependInfo || needRescanDirInfo || needRescanDependencies)
    {
    // The dependencies must be regenerated.
    std::string targetName = cmSystemTools::GetFilenameName(dir);
    targetName = targetName.substr(0, targetName.length()-4);
    std::string message = "Scanning dependencies of target ";
    message += targetName;
    cmSystemTools::MakefileColorEcho(
      cmsysTerminal_Color_ForegroundMagenta |
      cmsysTerminal_Color_ForegroundBold,
      message.c_str(), true, color);

    return this->ScanDependencies(dir.c_str(), validDependencies);
    }

  // The dependencies are already up-to-date.
  return true;
}